

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdevice.cpp
# Opt level: O3

bool __thiscall QPrintDevice::supportsMultipleCopies(QPrintDevice *this)

{
  QPlatformPrintDevice *pQVar1;
  int iVar2;
  
  pQVar1 = (this->d).value.ptr;
  if (pQVar1 != (QPlatformPrintDevice *)0x0) {
    iVar2 = (*pQVar1->_vptr_QPlatformPrintDevice[6])();
    if ((char)iVar2 != '\0') {
      iVar2 = (*((this->d).value.ptr)->_vptr_QPlatformPrintDevice[0xb])();
      return SUB41(iVar2,0);
    }
  }
  return false;
}

Assistant:

bool QPrintDevice::supportsMultipleCopies() const
{
    return isValid() && d->supportsMultipleCopies();
}